

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

void __thiscall LongReadsMapper::update_indexes(LongReadsMapper *this)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  uint uVar1;
  pointer pLVar2;
  long lVar3;
  pointer pvVar4;
  pointer puVar5;
  bool bVar6;
  ostream *poVar7;
  pointer plVar8;
  long lVar9;
  int64_t i;
  ulong uVar10;
  long lVar11;
  unsigned_long local_38;
  
  bVar6 = std::
          is_sorted<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                    ((this->mappings).
                     super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->mappings).
                     super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (!bVar6) {
    poVar7 = sdglib::OutputLog(INFO,true);
    poVar7 = std::operator<<(poVar7,"Sorting mappings");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::
    __sort<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->mappings).
               super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->mappings).
               super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  this_01 = &this->reads_in_node;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_01,((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x38);
  this_00 = &this->first_mapping;
  plVar8 = (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar8) {
    (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar8;
  }
  local_38 = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::resize
            (this_00,(long)(this->datastore->read_to_fileRecord).
                           super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->datastore->read_to_fileRecord).
                           super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4,(value_type_conflict *)&local_38);
  lVar11 = 8;
  for (uVar10 = 0;
      pLVar2 = (this->mappings).
               super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->mappings).
                             super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 5);
      uVar10 = uVar10 + 1) {
    plVar8 = (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = *(uint *)((long)&pLVar2->node + lVar11);
    local_38 = (unsigned_long)uVar1;
    if ((ulong)((long)(this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)plVar8 >> 3) <= local_38) {
      local_38 = 0xffffffffffffffff;
      std::vector<long,_std::allocator<long>_>::resize
                (this_00,(ulong)(uVar1 + 1),(value_type_conflict *)&local_38);
      local_38 = (unsigned_long)*(uint *)((long)&pLVar2->node + lVar11);
      plVar8 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    if (plVar8[local_38] == -1) {
      plVar8[local_38] = uVar10;
    }
    lVar3 = *(long *)((long)pLVar2 + lVar11 + -8);
    lVar9 = -lVar3;
    if (0 < lVar3) {
      lVar9 = lVar3;
    }
    pvVar4 = (this_01->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar5 = *(pointer *)
              ((long)&pvVar4[lVar9].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    if ((pvVar4[lVar9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start == puVar5) || (puVar5[-1] != local_38)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (pvVar4 + lVar9,&local_38);
    }
    lVar11 = lVar11 + 0x20;
  }
  return;
}

Assistant:

void LongReadsMapper::update_indexes() {
    if (!std::is_sorted(mappings.begin(), mappings.end())) {
        sdglib::OutputLog() << "Sorting mappings" << std::endl;
        sdglib::sort(mappings.begin(), mappings.end());
    }
    reads_in_node.clear();
    reads_in_node.resize(sg.nodes.size());
    first_mapping.clear();
    first_mapping.resize(datastore.size()+1,-1);
    for (int64_t i=0;i<mappings.size();++i){
        auto &m=mappings[i];
        if (first_mapping.size()<=m.read_id) first_mapping.resize(m.read_id+1,-1);
        if (first_mapping[m.read_id]==-1) first_mapping[m.read_id]=i;
        if (reads_in_node[std::abs(m.node)].empty() or reads_in_node[std::abs(m.node)].back()!=m.read_id)
            reads_in_node[std::abs(m.node)].push_back(m.read_id);
    }
}